

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O0

void __thiscall cp::CoMTrack::calcCoMTrack(CoMTrack *this,Vector2 *ref_cp)

{
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_00;
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_118;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_b0;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_68;
  undefined1 local_48 [8];
  Vector2 com_pos;
  Vector2 com_vel;
  Vector2 now_com_pos;
  Vector2 *ref_cp_local;
  CoMTrack *this_local;
  
  this_00 = (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
            (com_vel.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
             array + 1);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)this_00);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (com_pos.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_48);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x48),0);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<(&local_68,this_00,pSVar2);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x48),1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_68,pSVar2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_68);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (&local_c8,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)ref_cp,
             (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
             (com_vel.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::operator*(&local_b0,(double *)(this + 0x40),(StorageBaseType *)&local_c8);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)
             (com_pos.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
              *)&local_b0);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            (&local_118,
             (MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)
             (com_pos.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1),(double *)(this + 0x38));
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator+
            (&local_f8,
             (MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)
             (com_vel.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1),
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
              *)&local_118);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)local_48,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
              *)&local_f8);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_48,0);
  SVar1 = *pSVar3;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x48),0);
  *pSVar2 = SVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_48,1);
  SVar1 = *pSVar3;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x48),1);
  *pSVar2 = SVar1;
  return;
}

Assistant:

void CoMTrack::calcCoMTrack(const Vector2& ref_cp) {
  Vector2 now_com_pos, com_vel, com_pos;
  now_com_pos << ref_com[0], ref_com[1];
  com_vel = w_s * (ref_cp - now_com_pos);
  com_pos = now_com_pos + com_vel * dt_s;
  ref_com[0] = com_pos[0];
  ref_com[1] = com_pos[1];
}